

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

void save_load(gdmf *d,io_buf *model_file,bool read,bool text)

{
  size_t sVar1;
  ostream *data;
  byte in_CL;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  weight *v;
  uint64_t k;
  weight *w_i;
  stringstream msg;
  size_t K;
  size_t brw;
  uint64_t i;
  uint32_t stride;
  uint64_t length;
  vw *all;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined6 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  parameters *in_stack_fffffffffffffdd8;
  sparse_parameters *in_stack_fffffffffffffde0;
  ostream *in_stack_fffffffffffffde8;
  weight *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  io_buf *in_stack_fffffffffffffe08;
  ulong local_1f0;
  uint *in_stack_fffffffffffffe18;
  weight *pwVar2;
  dense_parameters *in_stack_fffffffffffffe20;
  stringstream local_1d0 [16];
  ostream local_1c0;
  ulong local_48;
  bool *local_40;
  ulong local_38;
  uint32_t local_2c;
  ulong local_28;
  long local_20;
  byte local_12;
  byte local_11;
  long local_10;
  long *local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_20 = *in_RDI;
  local_28 = 1L << ((byte)*(undefined4 *)(local_20 + 0x50) & 0x3f);
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((local_11 != 0) &&
     (initialize_regressor((vw *)0x236469), (*(byte *)(local_20 + 0x3450) & 1) != 0)) {
    local_2c = parameters::stride((parameters *)
                                  CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    if ((*(byte *)(local_20 + 0x3590) & 1) == 0) {
      dense_parameters::set_default<unsigned_int,set_rand_wrapper<dense_parameters>>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    }
    else {
      sparse_parameters::set_default<unsigned_int,set_rand_wrapper<sparse_parameters>>
                (in_stack_fffffffffffffde0,(uint *)in_stack_fffffffffffffdd8);
    }
  }
  sVar1 = v_array<int>::size((v_array<int> *)(local_10 + 0x30));
  if (sVar1 != 0) {
    local_38 = 0;
    do {
      local_40 = (bool *)0x0;
      local_48 = (ulong)((int)local_8[5] * 2 + 1);
      std::__cxx11::stringstream::stringstream(local_1d0);
      data = (ostream *)std::ostream::operator<<(&local_1c0,local_38);
      std::operator<<(data," ");
      in_stack_fffffffffffffdf8 =
           bin_text_read_write_fixed
                     (in_stack_fffffffffffffe08,(char *)data,in_stack_fffffffffffffdf8,
                      (char *)in_stack_fffffffffffffdf0,
                      SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0),
                      (stringstream *)in_stack_fffffffffffffde0,
                      SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
      local_40 = (bool *)(in_stack_fffffffffffffdf8 + (long)local_40);
      if (local_40 != (bool *)0x0) {
        in_stack_fffffffffffffdf0 =
             parameters::strided_index
                       (in_stack_fffffffffffffdd8,
                        CONCAT17(in_stack_fffffffffffffdd7,
                                 CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
        pwVar2 = in_stack_fffffffffffffdf0;
        for (local_1f0 = 0; local_1f0 < local_48; local_1f0 = local_1f0 + 1) {
          in_stack_fffffffffffffe08 = (io_buf *)(pwVar2 + local_1f0);
          in_stack_fffffffffffffde8 =
               (ostream *)std::ostream::operator<<(&local_1c0,in_stack_fffffffffffffe08);
          std::operator<<(in_stack_fffffffffffffde8," ");
          in_stack_fffffffffffffde0 =
               (sparse_parameters *)
               bin_text_read_write_fixed
                         (in_stack_fffffffffffffe08,(char *)data,in_stack_fffffffffffffdf8,
                          (char *)in_stack_fffffffffffffdf0,
                          SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0),
                          (stringstream *)in_stack_fffffffffffffde0,
                          SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
          local_40 = local_40 + (long)&(in_stack_fffffffffffffde0->_map)._M_h;
        }
      }
      if ((local_12 & 1) != 0) {
        std::operator<<(&local_1c0,"\n");
        in_stack_fffffffffffffdd8 =
             (parameters *)
             bin_text_read_write_fixed
                       (in_stack_fffffffffffffe08,(char *)data,in_stack_fffffffffffffdf8,
                        (char *)in_stack_fffffffffffffdf0,
                        SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0),
                        (stringstream *)in_stack_fffffffffffffde0,
                        SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
        local_40 = &in_stack_fffffffffffffdd8->sparse + (long)local_40;
      }
      if ((local_11 & 1) == 0) {
        local_38 = local_38 + 1;
      }
      std::__cxx11::stringstream::~stringstream(local_1d0);
      if (((local_11 & 1) != 0) || (in_stack_fffffffffffffdd7 = true, local_28 <= local_38)) {
        in_stack_fffffffffffffdd6 = (local_11 & 1) != 0 && local_40 != (bool *)0x0;
        in_stack_fffffffffffffdd7 = in_stack_fffffffffffffdd6;
      }
    } while ((bool)in_stack_fffffffffffffdd7 != false);
  }
  return;
}

Assistant:

void save_load(gdmf& d, io_buf& model_file, bool read, bool text)
{
  vw& all = *d.all;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
  {
    initialize_regressor(all);
    if (all.random_weights)
    {
      uint32_t stride = all.weights.stride();
      if (all.weights.sparse)
        all.weights.sparse_weights.set_default<uint32_t, set_rand_wrapper<sparse_parameters> >(stride);
      else
        all.weights.dense_weights.set_default<uint32_t, set_rand_wrapper<dense_parameters> >(stride);
    }
  }

  if (model_file.files.size() > 0)
  {
    uint64_t i = 0;
    size_t brw = 1;
    do
    {
      brw = 0;
      size_t K = d.rank * 2 + 1;
      stringstream msg;
      msg << i << " ";
      brw += bin_text_read_write_fixed(model_file, (char*)&i, sizeof(i), "", read, msg, text);
      if (brw != 0)
      {
        weight* w_i = &(all.weights.strided_index(i));
        for (uint64_t k = 0; k < K; k++)
        {
          weight* v = w_i + k;
          msg << v << " ";
          brw += bin_text_read_write_fixed(model_file, (char*)v, sizeof(*v), "", read, msg, text);
        }
      }
      if (text)
      {
        msg << "\n";
        brw += bin_text_read_write_fixed(model_file, nullptr, 0, "", read, msg, text);
      }

      if (!read)
        ++i;
    } while ((!read && i < length) || (read && brw > 0));
  }
}